

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::TreePop(void)

{
  ImU32 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  uint uVar4;
  long lVar5;
  float fVar6;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  fVar6 = (pIVar2->DC).IndentX - (pIVar3->Style).IndentSpacing;
  (pIVar2->DC).IndentX = fVar6;
  (pIVar2->DC).CursorPos.x = fVar6 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffsetX;
  uVar4 = (pIVar2->DC).TreeDepth - 1;
  (pIVar2->DC).TreeDepth = uVar4;
  if ((((pIVar3->NavMoveDir == 0) && (pIVar3->NavWindow == pIVar2)) &&
      (pIVar3->NavMoveRequest == true)) &&
     ((((pIVar3->NavMoveResultLocal).ID == 0 && ((pIVar3->NavMoveResultOther).ID == 0)) &&
      ((pIVar3->NavIdIsAlive == true &&
       (((pIVar2->DC).TreeDepthMayJumpToParentOnPop >> (uVar4 & 0x1f) & 1) != 0)))))) {
    lVar5 = (long)(pIVar2->IDStack).Size;
    if (lVar5 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4ca,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
    }
    SetNavID((pIVar2->IDStack).Data[lVar5 + -1],pIVar3->NavLayer);
    NavMoveRequestCancel();
  }
  pIVar1 = &(pIVar2->DC).TreeDepthMayJumpToParentOnPop;
  *pIVar1 = *pIVar1 & ~(-1 << ((byte)(pIVar2->DC).TreeDepth & 0x1f));
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeDepthMayJumpToParentOnPop & (1 << window->DC.TreeDepth)))
        {
            SetNavID(window->IDStack.back(), g.NavLayer);
            NavMoveRequestCancel();
        }
    window->DC.TreeDepthMayJumpToParentOnPop &= (1 << window->DC.TreeDepth) - 1;

    PopID();
}